

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O3

int Sbd_ProblemSolve(Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vWinObjs,
                    Vec_Int_t *vObj2Var,Vec_Int_t *vTfo,Vec_Int_t *vRoots,Vec_Int_t *vDivSet,
                    int nStrs,Sbd_Str_t *pStr0)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  sat_solver *s;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Sbd_Str_t *pSVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int pVarsQbf [256];
  int pVarsCec [256];
  int local_8a4;
  ulong local_8a0;
  sat_solver *local_898;
  ulong local_890;
  Vec_Int_t *local_888;
  int local_87c;
  long local_878;
  ulong local_870;
  Vec_Int_t *local_868;
  ulong local_860;
  uint local_854;
  ulong local_850;
  ulong local_848;
  ulong local_840;
  int local_838 [256];
  timespec local_438 [64];
  
  local_898 = (sat_solver *)CONCAT44(local_898._4_4_,Pivot);
  uVar10 = (ulong)nStrs;
  local_888 = vObj2Var;
  clock_gettime(3,local_438);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  uVar12 = 0;
  local_868 = vTfo;
  local_898 = Sbd_ManSatSolver((sat_solver *)0x0,p,vMirrors,(int)local_898,vWinObjs,local_888,vTfo,
                               vRoots,1);
  s = sat_solver_new();
  uVar13 = vDivSet->nSize;
  uVar7 = (ulong)uVar13;
  if (0 < (long)uVar10) {
    uVar12 = 0;
    pSVar8 = pStr0;
    do {
      iVar3 = 1 << ((byte)pSVar8->nVarIns & 0x1f);
      if (pSVar8->fLut == 0) {
        iVar3 = pSVar8->nVarIns;
      }
      uVar12 = (ulong)(uint)((int)uVar12 + iVar3);
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 < pStr0 + uVar10);
  }
  local_8a0 = uVar10;
  if (10 < (int)uVar13) {
    __assert_fail("Vec_IntSize(vDivSet) <= SBD_DIV_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                  ,0xd6,
                  "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                 );
  }
  local_878 = (long)(int)uVar13;
  uVar9 = uVar13 + nStrs;
  iVar3 = (int)uVar12;
  if (0x100 < (int)(iVar3 + uVar9)) {
    __assert_fail("nVars + nStrs + nPars <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                  ,0xd7,
                  "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                 );
  }
  local_870 = (ulong)(uint)(local_868->nSize + vWinObjs->nSize + vRoots->nSize);
  if (0 < (int)uVar13) {
    memcpy(local_438,vDivSet->pArray,uVar7 * 4);
  }
  if (0 < (int)local_8a0) {
    lVar5 = (local_8a0 & 0xffffffff) - 1;
    auVar14._8_4_ = (int)lVar5;
    auVar14._0_8_ = lVar5;
    auVar14._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar14 = auVar14 ^ _DAT_0094e250;
    uVar10 = local_870;
    auVar20 = _DAT_0094e240;
    do {
      auVar19 = auVar20 ^ _DAT_0094e250;
      iVar11 = (int)uVar10;
      if ((bool)(~(auVar19._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar19._0_4_ ||
                  auVar14._4_4_ < auVar19._4_4_) & 1)) {
        *(int *)((long)&local_438[0].tv_sec + lVar5 + local_878 * 4) = iVar11;
      }
      if ((auVar19._12_4_ != auVar14._12_4_ || auVar19._8_4_ <= auVar14._8_4_) &&
          auVar19._12_4_ <= auVar14._12_4_) {
        *(int *)((long)&local_438[0].tv_sec + lVar5 + local_878 * 4 + 4) = iVar11 + 1;
      }
      lVar6 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar6 + 2;
      lVar5 = lVar5 + 8;
      uVar10 = (ulong)(iVar11 + 2);
    } while ((ulong)((int)local_8a0 + 1U >> 1) << 3 != lVar5);
  }
  local_890 = (ulong)(uint)((int)local_8a0 + (int)local_870);
  lVar5 = (long)(int)uVar9;
  if (0 < iVar3) {
    lVar6 = uVar12 - 1;
    auVar15._8_4_ = (int)lVar6;
    auVar15._0_8_ = lVar6;
    auVar15._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar15 = auVar15 ^ _DAT_0094e250;
    uVar10 = local_890;
    auVar19 = _DAT_0094e240;
    do {
      auVar20 = auVar19 ^ _DAT_0094e250;
      iVar11 = (int)uVar10;
      if ((bool)(~(auVar20._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar20._0_4_ ||
                  auVar15._4_4_ < auVar20._4_4_) & 1)) {
        *(int *)((long)&local_438[0].tv_sec + lVar6 + lVar5 * 4) = iVar11;
      }
      if ((auVar20._12_4_ != auVar15._12_4_ || auVar20._8_4_ <= auVar15._8_4_) &&
          auVar20._12_4_ <= auVar15._12_4_) {
        *(int *)((long)&local_438[0].tv_sec + lVar6 + lVar5 * 4 + 4) = iVar11 + 1;
      }
      lVar18 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar18 + 2;
      lVar6 = lVar6 + 8;
      uVar10 = (ulong)(iVar11 + 2);
    } while ((ulong)(iVar3 + 1U >> 1) << 3 != lVar6);
  }
  local_888 = (Vec_Int_t *)uVar12;
  local_860 = (ulong)uVar9;
  if (0 < (int)uVar9) {
    memset(local_838,0xff,(ulong)(uVar9 - 1) * 4 + 4);
  }
  iVar11 = (int)local_8a0;
  local_840 = uVar7;
  if (iVar3 < 1) {
    Sbd_ProblemAddClauses(local_898,(int)local_878,iVar11,(int *)local_438,pStr0);
    sat_solver_setnvars(s,1000);
    Sbd_ProblemAddClausesInit(s,uVar13,iVar11,local_838,pStr0);
    p_00->nSize = 0;
  }
  else {
    lVar6 = (long)local_888 - 1;
    auVar16._8_4_ = (int)lVar6;
    auVar16._0_8_ = lVar6;
    auVar16._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar10 = 0;
    auVar16 = auVar16 ^ _DAT_0094e250;
    auVar17 = _DAT_0094e240;
    do {
      auVar20 = auVar17 ^ _DAT_0094e250;
      if ((bool)(~(auVar20._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar20._0_4_ ||
                  auVar16._4_4_ < auVar20._4_4_) & 1)) {
        local_838[lVar5 + uVar10] = (int)uVar10;
      }
      if ((auVar20._12_4_ != auVar16._12_4_ || auVar20._8_4_ <= auVar16._8_4_) &&
          auVar20._12_4_ <= auVar16._12_4_) {
        local_838[lVar5 + uVar10 + 1] = (int)uVar10 + 1;
      }
      uVar10 = uVar10 + 2;
      lVar6 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar6 + 2;
    } while ((iVar3 + 1U & 0xfffffffe) != uVar10);
    Sbd_ProblemAddClauses(local_898,uVar13,iVar11,(int *)local_438,pStr0);
    sat_solver_setnvars(s,1000);
    Sbd_ProblemAddClausesInit(s,uVar13,iVar11,local_838,pStr0);
    p_00->nSize = 0;
    if (0 < iVar3) {
      iVar11 = (int)local_890 * 2 + 1;
      uVar7 = local_890 & 0xffffffff;
      uVar10 = uVar12;
      do {
        if ((int)uVar7 < 0) goto LAB_0054e8f6;
        Vec_IntPush(p_00,iVar11);
        iVar11 = iVar11 + 2;
        uVar7 = (ulong)((int)uVar7 + 1);
        uVar13 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar13;
      } while (uVar13 != 0);
    }
  }
  local_854 = 1 << ((byte)local_878 & 0x1f);
  local_848 = local_870 & 0xffffffff;
  iVar11 = (int)local_890;
  if ((int)local_854 < 2) {
    local_854 = 1;
  }
  uVar10 = local_860 & 0xffffffff;
  local_890 = (ulong)(uint)(iVar11 * 2);
  local_868 = (Vec_Int_t *)0x0;
  local_87c = iVar3;
  local_850 = uVar12;
  do {
    iVar3 = p_00->nSize;
    iVar2 = sat_solver_solve(local_898,p_00->pArray,p_00->pArray + iVar3,0,0,0,0);
    psVar1 = local_898;
    if (iVar2 != 1) {
      if (iVar2 != -1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                      ,0xf8,
                      "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                     );
      }
      goto LAB_0054e877;
    }
    p_00->nSize = 0;
    if (0 < (int)local_860) {
      uVar7 = 0;
      do {
        local_838[uVar7] = local_87c + (int)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
      local_87c = local_87c + (int)uVar7;
    }
    if (0 < vDivSet->nSize) {
      lVar5 = 0;
      do {
        iVar3 = vDivSet->pArray[lVar5];
        if (((long)iVar3 < 0) || (psVar1->size <= iVar3)) goto LAB_0054e8d7;
        if (local_838[lVar5] < 0) goto LAB_0054e8f6;
        local_8a4 = (uint)(psVar1->model[iVar3] != 1) + local_838[lVar5] * 2;
        iVar3 = sat_solver_addclause(s,&local_8a4,(lit *)&local_8a0);
        if (iVar3 == 0) {
          __assert_fail("status",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                        ,0x10b,
                        "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                       );
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < vDivSet->nSize);
    }
    if (((int)local_870 < 0) || (psVar1->size <= (int)local_870)) {
LAB_0054e8d7:
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0xda,"int sat_solver_var_value(sat_solver *, int)");
    }
    if (local_838[local_878] < 0) {
LAB_0054e8f6:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    local_8a4 = (uint)(psVar1->model[local_848] == 1) + local_838[local_878] * 2;
    iVar3 = sat_solver_addclause(s,&local_8a4,(lit *)&local_8a0);
    if (iVar3 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                    ,0x111,
                    "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                   );
    }
    iVar3 = Sbd_ProblemAddClauses(s,(int)local_840,(int)local_8a0,local_838,pStr0);
    if (iVar3 == 0) goto LAB_0054e872;
    iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar3 != 1) {
      if (iVar3 != -1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                      ,0x11b,
                      "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                     );
      }
      goto LAB_0054e872;
    }
    if (0 < (int)local_850) {
      uVar12 = local_890 & 0xffffffff;
      uVar7 = 0;
      do {
        if ((long)s->size <= (long)uVar7) goto LAB_0054e8d7;
        if (iVar11 + (int)uVar7 < 0) goto LAB_0054e8f6;
        Vec_IntPush(p_00,(uint)(s->model[uVar7] != 1) + (int)uVar12);
        uVar7 = uVar7 + 1;
        uVar12 = (ulong)((int)uVar12 + 2);
      } while (local_888 != (Vec_Int_t *)uVar7);
    }
    uVar13 = (int)local_868 + 1;
    local_868 = (Vec_Int_t *)(ulong)uVar13;
    if (uVar13 == local_854) {
LAB_0054e872:
      iVar3 = p_00->nSize;
LAB_0054e877:
      if (0 < iVar3) {
        Sbd_ProblemCollectSolution((int)local_8a0,pStr0,p_00);
      }
      sat_solver_delete(local_898);
      sat_solver_delete(s);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      return (uint)(0 < iVar3);
    }
  } while( true );
}

Assistant:

int Sbd_ProblemSolve( Gia_Man_t * p, Vec_Int_t * vMirrors, 
                       int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, 
                       Vec_Int_t * vTfo, Vec_Int_t * vRoots, 
                       Vec_Int_t * vDivSet, int nStrs, Sbd_Str_t * pStr0 )  // divisors, structures
{
    extern sat_solver * Sbd_ManSatSolver( sat_solver * pSat, Gia_Man_t * p, Vec_Int_t * vMirrors, int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fQbf );
    
    int fVerbose = 0;
    abctime clk = Abc_Clock();
    Vec_Int_t * vLits    = Vec_IntAlloc( 100 );
    sat_solver * pSatCec = Sbd_ManSatSolver( NULL, p, vMirrors, Pivot, vWinObjs, vObj2Var, vTfo, vRoots, 1 );
    sat_solver * pSatQbf = sat_solver_new();

    int nVars      = Vec_IntSize( vDivSet );
    int nPars      = Sbd_ProblemCountParams( nStrs, pStr0 );

    int VarCecOut  = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    int VarCecPar  = VarCecOut + nStrs;

    int VarQbfPar  = 0;
    int VarQbfFree = nPars;

    int pVarsCec[256];
    int pVarsQbf[256];
    int i, iVar, iLit, nIters;
    int RetValue = 0;

    assert( Vec_IntSize(vDivSet) <= SBD_DIV_MAX );
    assert( nVars + nStrs + nPars <= 256 );

    // collect CEC variables
    Vec_IntForEachEntry( vDivSet, iVar, i )
        pVarsCec[i] = iVar;
    for ( i = 0; i < nStrs; i++ )
        pVarsCec[nVars + i] = VarCecOut + i;
    for ( i = 0; i < nPars; i++ )
        pVarsCec[nVars + nStrs + i] = VarCecPar + i;

    // collect QBF variables
    for ( i = 0; i < nVars + nStrs; i++ )
        pVarsQbf[i] = -1;
    for ( i = 0; i < nPars; i++ )
        pVarsQbf[nVars + nStrs + i] = VarQbfPar + i;

    // add clauses to the CEC problem
    Sbd_ProblemAddClauses( pSatCec, nVars, nStrs, pVarsCec, pStr0 );

    // create QBF solver
    sat_solver_setnvars( pSatQbf, 1000 );
    Sbd_ProblemAddClausesInit( pSatQbf, nVars, nStrs, pVarsQbf, pStr0 );

    // assume all parameter variables are 0
    Vec_IntClear( vLits );
    for ( i = 0; i < nPars; i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(VarCecPar + i, 1) );
    for ( nIters = 0; nIters < (1 << nVars); nIters++ )
    {
        // check if these parameters solve the problem
        int status = sat_solver_solve( pSatCec, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        if ( status == l_False ) // solution found
            break;
        assert( status == l_True );

        if ( fVerbose )
        {
            printf( "Iter %3d : ", nIters );
            for ( i = 0; i < nPars; i++ )
                printf( "%d", !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) );
            printf( "    " );
        }

        Vec_IntClear( vLits );
        // create new QBF variables
        for ( i = 0; i < nVars + nStrs; i++ )
            pVarsQbf[i] = VarQbfFree++;
        // set their values
        Vec_IntForEachEntry( vDivSet, iVar, i )
        {
            iLit = Abc_Var2Lit( pVarsQbf[i], !sat_solver_var_value(pSatCec, iVar) );
            status = sat_solver_addclause( pSatQbf, &iLit, &iLit + 1 );
            assert( status );
            if ( fVerbose )
                printf( "%d", sat_solver_var_value(pSatCec, iVar) );
        }
        iLit = Abc_Var2Lit( pVarsQbf[nVars], sat_solver_var_value(pSatCec, VarCecOut) );
        status = sat_solver_addclause( pSatQbf, &iLit, &iLit + 1 );
        assert( status );
        if ( fVerbose )
            printf( " %d\n", !sat_solver_var_value(pSatCec, VarCecOut) );
        // add clauses to the QBF problem
        if ( !Sbd_ProblemAddClauses( pSatQbf, nVars, nStrs, pVarsQbf, pStr0 ) )
            break; // solution does not exist
        // check if solution still exists
        status = sat_solver_solve( pSatQbf, NULL, NULL, 0, 0, 0, 0 );
        if ( status == l_False ) // solution does not exist
            break;
        assert( status == l_True ); 
        // find the new values of parameters
        assert( Vec_IntSize(vLits) == 0 );
        for ( i = 0; i < nPars; i++ )
            Vec_IntPush( vLits, Abc_Var2Lit(VarCecPar + i, !sat_solver_var_value(pSatQbf, VarQbfPar + i)) );
    }
    if ( Vec_IntSize(vLits) > 0 )
    {
        //Sbd_ProblemPrintSolution( nStrs, pStr0, vLits );
        Sbd_ProblemCollectSolution( nStrs, pStr0, vLits );
        RetValue = 1;
    }
    sat_solver_delete( pSatCec );
    sat_solver_delete( pSatQbf );
    Vec_IntFree( vLits );

    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}